

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::UndoBuffer::RevertCommit
          (UndoBuffer *this,IteratorState *end_state,transaction_t transaction_id)

{
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoFlags *pUVar3;
  CommitState state;
  BufferHandle local_90;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_78;
  UndoFlags *local_70;
  UndoFlags *local_68;
  UndoBuffer *local_60;
  CommitState local_58;
  BufferHandle local_48;
  
  CommitState::CommitState(&local_58,this->transaction,transaction_id);
  BufferHandle::BufferHandle(&local_90);
  local_78.ptr = (this->allocator).tail.ptr;
  local_60 = this;
  if (local_78.ptr != (UndoBufferEntry *)0x0) {
    do {
      pBVar2 = (local_60->allocator).buffer_manager;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_78);
      (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&(local_78.ptr)->block);
      BufferHandle::operator=(&local_90,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&local_90.node);
      pUVar3 = (UndoFlags *)(local_90.node.ptr)->buffer;
      local_70 = pUVar3;
      if (local_78.ptr == (end_state->current).ptr) {
        local_68 = (UndoFlags *)end_state->start;
      }
      else {
        optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_78);
        local_68 = (UndoFlags *)((long)pUVar3 + (local_78.ptr)->position);
      }
      if (local_70 < local_68) {
        do {
          type = *local_70;
          UVar1 = local_70[1];
          local_70 = local_70 + 2;
          CommitState::RevertCommit(&local_58,type,(data_ptr_t)local_70);
          local_70 = (UndoFlags *)((ulong)UVar1 + (long)local_70);
        } while (local_70 < local_68);
      }
      if (local_78.ptr == (end_state->current).ptr) break;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_78);
      local_78.ptr = ((local_78.ptr)->prev).ptr;
    } while (local_78.ptr != (UndoBufferEntry *)0x0);
  }
  BufferHandle::~BufferHandle(&local_90);
  return;
}

Assistant:

void UndoBuffer::RevertCommit(UndoBuffer::IteratorState &end_state, transaction_t transaction_id) {
	CommitState state(transaction, transaction_id);
	UndoBuffer::IteratorState start_state;
	IterateEntries(start_state, end_state, [&](UndoFlags type, data_ptr_t data) { state.RevertCommit(type, data); });
}